

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O0

CVmWeakRef * __thiscall CVmWeakRefable::get_weak_ref(CVmWeakRefable *this)

{
  void *pvVar1;
  long in_RDI;
  CVmWeakRefable *in_stack_ffffffffffffffe8;
  CVmWeakRef *in_stack_fffffffffffffff0;
  
  OS_Mutex::lock((OS_Mutex *)0x32cb1c);
  if (*(long *)(in_RDI + 0x18) == 0) {
    pvVar1 = operator_new(0x20);
    CVmWeakRef::CVmWeakRef(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    *(void **)(in_RDI + 0x18) = pvVar1;
  }
  OS_Mutex::unlock((OS_Mutex *)0x32cb83);
  CVmRefCntObj::add_ref((CVmRefCntObj *)0x32cb91);
  return *(CVmWeakRef **)(in_RDI + 0x18);
}

Assistant:

CVmWeakRef *CVmWeakRefable::get_weak_ref()
{
    /* lock out other updaters */
    mu->lock();
    
    /* if we don't already have a weak reference object, create one */
    if (weakref == 0)
        weakref = new CVmWeakRef(this);

    /* done with the lock */
    mu->unlock();
    
    /* add a reference on behalf of our caller */
    weakref->add_ref();

    /* return the weak reference object */
    return weakref;
}